

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredpointcloud.cc
# Opt level: O0

void __thiscall
gvr::ColoredPointCloud::ColoredPointCloud
          (ColoredPointCloud *this,ColoredMesh *p,vector<bool,_std::allocator<bool>_> *vused)

{
  const_reference cVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  _func_int **pp_Var5;
  ColoredMesh *in_RSI;
  PointCloud *in_RDI;
  ulong uVar6;
  int i;
  int k;
  PointCloud *in_stack_00000058;
  PointCloud *in_stack_00000060;
  int iVar7;
  int i_00;
  int local_28;
  
  PointCloud::PointCloud
            (in_stack_00000060,in_stack_00000058,(vector<bool,_std::allocator<bool>_> *)this);
  (in_RDI->super_Model)._vptr_Model = (_func_int **)&PTR__ColoredPointCloud_001f9118;
  iVar3 = PointCloud::getVertexCount(in_RDI);
  uVar6 = (ulong)(iVar3 * 3);
  if ((long)uVar6 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pp_Var5 = (_func_int **)operator_new__(uVar6);
  in_RDI[1].super_Model._vptr_Model = pp_Var5;
  local_28 = 0;
  iVar7 = 0;
  while (i_00 = iVar7, iVar4 = PointCloud::getVertexCount((PointCloud *)in_RSI), iVar7 < iVar4) {
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)CONCAT44(i_00,iVar3),(size_type)in_RDI
                      );
    if (cVar1) {
      uVar2 = ColoredMesh::getColorComp(in_RSI,i_00,0);
      *(uchar *)((long)in_RDI[1].super_Model._vptr_Model + (long)local_28) = uVar2;
      uVar2 = ColoredMesh::getColorComp(in_RSI,i_00,1);
      iVar7 = local_28 + 2;
      *(uchar *)((long)in_RDI[1].super_Model._vptr_Model + (long)(local_28 + 1)) = uVar2;
      uVar2 = ColoredMesh::getColorComp(in_RSI,i_00,2);
      local_28 = local_28 + 3;
      *(uchar *)((long)in_RDI[1].super_Model._vptr_Model + (long)iVar7) = uVar2;
    }
    iVar7 = i_00 + 1;
  }
  return;
}

Assistant:

ColoredPointCloud::ColoredPointCloud(const ColoredMesh &p,
                                     const std::vector<bool> &vused) : PointCloud(p, vused)
{
  rgb=new unsigned char [3*getVertexCount()];

  int k=0;

  for (int i=0; i<p.getVertexCount(); i++)
  {
    if (vused[i])
    {
      rgb[k++]=p.getColorComp(i, 0);
      rgb[k++]=p.getColorComp(i, 1);
      rgb[k++]=p.getColorComp(i, 2);
    }
  }
}